

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::cmQtAutoGenInitializer
          (cmQtAutoGenInitializer *this,cmQtAutoGenGlobalInitializer *globalInitializer,
          cmGeneratorTarget *genTarget,IntegerVersion *qtVersion,bool mocEnabled,bool uicEnabled,
          bool rccEnabled,bool globalAutogenTarget,bool globalAutoRccTarget)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  cmTarget *this_01;
  byte bVar2;
  bool bVar3;
  cmGlobalGenerator *pcVar4;
  cmLocalGenerator *pcVar5;
  char *__s;
  bool local_1c1;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  IntegerVersion local_cc;
  byte local_c3;
  byte local_c2;
  allocator<char> local_c1;
  string local_c0;
  cmValue local_a0;
  allocator<char> local_91;
  string local_90;
  cmValue local_70;
  allocator<char> local_61;
  string local_60;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  bool globalAutoRccTarget_local;
  bool globalAutogenTarget_local;
  bool rccEnabled_local;
  bool uicEnabled_local;
  IntegerVersion *pIStack_28;
  bool mocEnabled_local;
  IntegerVersion *qtVersion_local;
  cmGeneratorTarget *genTarget_local;
  cmQtAutoGenGlobalInitializer *globalInitializer_local;
  cmQtAutoGenInitializer *this_local;
  
  local_2b = rccEnabled;
  local_2c = globalAutogenTarget;
  local_2d = globalAutoRccTarget;
  this->GlobalInitializer = globalInitializer;
  this->GenTarget = genTarget;
  local_2a = uicEnabled;
  local_29 = mocEnabled;
  pIStack_28 = qtVersion;
  qtVersion_local = (IntegerVersion *)genTarget;
  genTarget_local = (cmGeneratorTarget *)globalInitializer;
  globalInitializer_local = (cmQtAutoGenGlobalInitializer *)this;
  pcVar4 = cmGeneratorTarget::GetGlobalGenerator(genTarget);
  this->GlobalGen = pcVar4;
  pcVar5 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)qtVersion_local);
  this->LocalGen = pcVar5;
  this->Makefile = (cmMakefile *)qtVersion_local[1];
  cmFilePathChecksum::cmFilePathChecksum(&this->PathCheckSum,(cmMakefile *)qtVersion_local[1]);
  this->QtVersion = *pIStack_28;
  this->Verbosity = 0;
  this->MultiConfig = false;
  this->CrossConfig = false;
  this->UseBetterGraph = false;
  this->CMP0071Accept = false;
  this->CMP0071Warn = false;
  this->CMP0100Accept = false;
  this->CMP0100Warn = false;
  std::__cxx11::string::string((string *)&this->ConfigDefault);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ConfigsList);
  std::__cxx11::string::string((string *)&this->TargetsFolder);
  {unnamed_type#1}::cmQtAutoGenInitializer((_unnamed_type_1_ *)&this->Dir);
  {unnamed_type#2}::cmQtAutoGenInitializer((_unnamed_type_2_ *)&this->AutogenTarget);
  MocT::MocT(&this->Moc);
  UicT::UicT(&this->Uic);
  RccT::RccT(&this->Rcc);
  (this->AutogenTarget).GlobalTarget = (bool)(local_2c & 1);
  (this->Moc).super_GenVarsT.Enabled = (bool)(local_29 & 1);
  (this->Uic).super_GenVarsT.Enabled = (bool)(local_2a & 1);
  (this->Rcc).super_GenVarsT.Enabled = (bool)(local_2b & 1);
  (this->Rcc).GlobalTarget = (bool)(local_2d & 1);
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_CROSS_CONFIGS",&local_61);
  cmMakefile::GetSafeDefinition(this_00,&local_60);
  bVar2 = std::__cxx11::string::empty();
  this->CrossConfig = (bool)(bVar2 ^ 1);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pcVar1 = this->GenTarget;
  std::allocator<char>::allocator();
  local_c2 = 0;
  local_c3 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"AUTOGEN_BETTER_GRAPH_MULTI_CONFIG",&local_91);
  local_70 = cmGeneratorTarget::GetProperty(pcVar1,&local_90);
  bVar3 = cmValue::IsSet(&local_70);
  if (bVar3) {
    pcVar1 = this->GenTarget;
    std::allocator<char>::allocator();
    local_c2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"AUTOGEN_BETTER_GRAPH_MULTI_CONFIG",&local_c1);
    local_c3 = 1;
    local_a0 = cmGeneratorTarget::GetProperty(pcVar1,&local_c0);
    local_1c1 = cmValue::IsOn(&local_a0);
  }
  else {
    cmQtAutoGen::IntegerVersion::IntegerVersion(&local_cc,6,8);
    local_1c1 = cmQtAutoGen::IntegerVersion::operator>=(&this->QtVersion,local_cc);
  }
  this->UseBetterGraph = local_1c1;
  if ((local_c3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_c1);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  this_01 = this->GenTarget->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"AUTOGEN_BETTER_GRAPH_MULTI_CONFIG",&local_f1);
  __s = "OFF";
  if ((this->UseBetterGraph & 1U) != 0) {
    __s = "ON";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,__s,&local_119);
  cmTarget::SetProperty(this_01,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  return;
}

Assistant:

cmQtAutoGenInitializer::cmQtAutoGenInitializer(
  cmQtAutoGenGlobalInitializer* globalInitializer,
  cmGeneratorTarget* genTarget, IntegerVersion const& qtVersion,
  bool mocEnabled, bool uicEnabled, bool rccEnabled, bool globalAutogenTarget,
  bool globalAutoRccTarget)
  : GlobalInitializer(globalInitializer)
  , GenTarget(genTarget)
  , GlobalGen(genTarget->GetGlobalGenerator())
  , LocalGen(genTarget->GetLocalGenerator())
  , Makefile(genTarget->Makefile)
  , PathCheckSum(genTarget->Makefile)
  , QtVersion(qtVersion)
{
  this->AutogenTarget.GlobalTarget = globalAutogenTarget;
  this->Moc.Enabled = mocEnabled;
  this->Uic.Enabled = uicEnabled;
  this->Rcc.Enabled = rccEnabled;
  this->Rcc.GlobalTarget = globalAutoRccTarget;
  this->CrossConfig =
    !this->Makefile->GetSafeDefinition("CMAKE_CROSS_CONFIGS").empty();
  this->UseBetterGraph =
    this->GenTarget->GetProperty("AUTOGEN_BETTER_GRAPH_MULTI_CONFIG").IsSet()
    ? this->GenTarget->GetProperty("AUTOGEN_BETTER_GRAPH_MULTI_CONFIG").IsOn()
    : (this->QtVersion >= IntegerVersion(6, 8));
  // AUTOGEN_BETTER_GRAPH_MULTI_CONFIG is set explicitly because it is read by
  // the qt library
  this->GenTarget->Target->SetProperty("AUTOGEN_BETTER_GRAPH_MULTI_CONFIG",
                                       this->UseBetterGraph ? "ON" : "OFF");
}